

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O3

void google::protobuf::uint128::DivModImpl
               (uint128 dividend,uint128 divisor,uint128 *quotient_ret,uint128 *remainder_ret)

{
  int iVar1;
  int iVar2;
  LogMessage *pLVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  protobuf *this;
  ulong uVar9;
  ulong uVar10;
  protobuf *ppVar11;
  uint uVar12;
  bool bVar13;
  uint128 n;
  uint128 n_00;
  LogFinisher local_71;
  uint128 *local_70;
  LogMessage local_68;
  uint64 extraout_RDX;
  
  uVar6 = divisor.hi_;
  n.hi_ = (protobuf *)divisor.lo_;
  n.lo_ = dividend.hi_;
  this = (protobuf *)dividend.lo_;
  if (n.hi_ == (protobuf *)0x0 && uVar6 == 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,"third_party/protobuf-lite/int128.cc",0x56);
    pLVar3 = internal::LogMessage::operator<<(&local_68,"Division or mod by zero: dividend.hi=");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,n.lo_);
    pLVar3 = internal::LogMessage::operator<<(pLVar3,", lo=");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,(unsigned_long)this);
    internal::LogFinisher::operator=(&local_71,pLVar3);
    internal::LogMessage::~LogMessage(&local_68);
  }
  else {
    bVar13 = n.lo_ < uVar6;
    if (n.lo_ == uVar6) {
      bVar13 = this < n.hi_;
    }
    if (bVar13) {
      quotient_ret->lo_ = 0;
      quotient_ret->hi_ = 0;
    }
    else {
      local_70 = quotient_ret;
      iVar1 = Fls128(this,n);
      n_00.hi_ = extraout_RDX;
      n_00.lo_ = uVar6;
      iVar2 = Fls128(n.hi_,n_00);
      uVar12 = iVar1 - iVar2;
      if ((int)uVar12 < 0) {
        uVar9 = 0;
        uVar4 = 0;
      }
      else {
        uVar7 = (ulong)uVar12;
        iVar1 = uVar12 + 1;
        uVar4 = 0;
        uVar8 = 0;
        do {
          bVar5 = (byte)uVar7;
          if (uVar7 < 0x40) {
            uVar10 = uVar6;
            ppVar11 = n.hi_;
            if (uVar7 != 0) {
              uVar10 = uVar6 << (bVar5 & 0x3f) | (ulong)n.hi_ >> 0x40 - (bVar5 & 0x3f);
              ppVar11 = (protobuf *)((long)n.hi_ << (bVar5 & 0x3f));
            }
          }
          else {
            if (uVar7 < 0x80) {
              uVar10 = (long)n.hi_ << (bVar5 & 0x3f);
            }
            else {
              uVar10 = 0;
            }
            ppVar11 = (protobuf *)0x0;
          }
          uVar9 = uVar8 * 2;
          bVar13 = uVar10 <= n.lo_;
          if (n.lo_ == uVar10) {
            bVar13 = ppVar11 <= this;
          }
          if (bVar13) {
            bVar13 = this < ppVar11;
            this = this + -(long)ppVar11;
            n.lo_ = (n.lo_ - uVar10) - (ulong)bVar13;
            uVar9 = uVar9 | 1;
          }
          uVar4 = uVar4 << 1 | uVar8 >> 0x3f;
          uVar7 = uVar7 - 1;
          iVar1 = iVar1 + -1;
          uVar8 = uVar9;
        } while (0 < iVar1);
      }
      local_70->lo_ = uVar9;
      local_70->hi_ = uVar4;
    }
    remainder_ret->lo_ = (uint64)this;
    remainder_ret->hi_ = n.lo_;
  }
  return;
}

Assistant:

void uint128::DivModImpl(uint128 dividend, uint128 divisor,
                         uint128* quotient_ret, uint128* remainder_ret) {
  if (divisor == 0) {
    GOOGLE_LOG(FATAL) << "Division or mod by zero: dividend.hi=" << dividend.hi_
                      << ", lo=" << dividend.lo_;
  } else if (dividend < divisor) {
    *quotient_ret = 0;
    *remainder_ret = dividend;
    return;
  } else {
    int dividend_bit_length = Fls128(dividend);
    int divisor_bit_length = Fls128(divisor);
    int difference = dividend_bit_length - divisor_bit_length;
    uint128 quotient = 0;
    while (difference >= 0) {
      quotient <<= 1;
      uint128 shifted_divisor = divisor << difference;
      if (shifted_divisor <= dividend) {
        dividend -= shifted_divisor;
        quotient += 1;
      }
      difference -= 1;
    }
    //record the final quotient and remainder
    *quotient_ret = quotient;
    *remainder_ret = dividend;
  }
}